

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_list.c
# Opt level: O0

opj_procedure_list_t * opj_procedure_list_create(void)

{
  opj_procedure *ppvVar1;
  opj_procedure_list_t *l_validation;
  opj_procedure_list_t *local_8;
  
  local_8 = (opj_procedure_list_t *)malloc(0x10);
  if (local_8 == (opj_procedure_list_t *)0x0) {
    local_8 = (opj_procedure_list_t *)0x0;
  }
  else {
    memset(local_8,0,0x10);
    local_8->m_nb_max_procedures = 10;
    ppvVar1 = (opj_procedure *)malloc(0x50);
    local_8->m_procedures = ppvVar1;
    if (local_8->m_procedures == (opj_procedure *)0x0) {
      free(local_8);
      local_8 = (opj_procedure_list_t *)0x0;
    }
    else {
      memset(local_8->m_procedures,0,0x50);
    }
  }
  return local_8;
}

Assistant:

opj_procedure_list_t *  opj_procedure_list_create()
{
	/* memory allocation */
	opj_procedure_list_t * l_validation = (opj_procedure_list_t *) opj_malloc(sizeof(opj_procedure_list_t));
	if
		(! l_validation)
	{
		return 00;
	}
	/* initialization */
	memset(l_validation,0,sizeof(opj_procedure_list_t));
	l_validation->m_nb_max_procedures = OPJ_VALIDATION_SIZE;
	l_validation->m_procedures = (void**)opj_malloc(
		OPJ_VALIDATION_SIZE * sizeof(opj_procedure));
	if
		(! l_validation->m_procedures)
	{
		opj_free(l_validation);
		return 00;
	}
	memset(l_validation->m_procedures,0,OPJ_VALIDATION_SIZE * sizeof(opj_procedure));
	return l_validation;
}